

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HexDump.cpp
# Opt level: O0

string * arangodb::velocypack::HexDump::toHex_abi_cxx11_(uint8_t value,string_view header)

{
  allocator<char> *in_RCX;
  undefined1 in_SIL;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  string *result;
  uint8_t in_stack_ffffffffffffffdf;
  undefined6 in_stack_ffffffffffffffe0;
  undefined1 uVar1;
  string *__t;
  
  uVar1 = 0;
  __t = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (unaff_retaddr,(basic_string_view<char,_std::char_traits<char>_> *)__t,in_RCX);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe5);
  appendHex((string *)CONCAT17(in_SIL,CONCAT16(uVar1,in_stack_ffffffffffffffe0)),
            in_stack_ffffffffffffffdf);
  return in_RDI;
}

Assistant:

std::string HexDump::toHex(uint8_t value, std::string_view header) {
  std::string result(header);
  appendHex(result, value);
  return result;
}